

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_perform(cpool *cpool)

{
  Curl_easy *data_00;
  Curl_llist_node *pCVar1;
  connectdata *conn_00;
  curltime cVar2;
  undefined4 uStack_64;
  _Bool local_59;
  timediff_t tStack_58;
  _Bool done;
  timediff_t ms;
  timediff_t next_from_now_ms;
  curltime now;
  curltime *nowp;
  connectdata *conn;
  Curl_llist_node *enext;
  Curl_llist_node *e;
  Curl_easy *data;
  cpool *cpool_local;
  
  data_00 = cpool->idata;
  enext = Curl_llist_head(&cpool->shutdowns);
  now.tv_usec = 0;
  now._12_4_ = 0;
  ms = 0;
  if (enext != (Curl_llist_node *)0x0) {
    while (enext != (Curl_llist_node *)0x0) {
      pCVar1 = Curl_node_next(enext);
      conn_00 = (connectdata *)Curl_node_elem(enext);
      Curl_attach_connection(data_00,conn_00);
      cpool_run_conn_shutdown(data_00,conn_00,&local_59);
      Curl_detach_connection(data_00);
      if ((local_59 & 1U) == 0) {
        if (now._8_8_ == 0) {
          cVar2 = Curl_now();
          next_from_now_ms = cVar2.tv_sec;
          now.tv_sec = CONCAT44(uStack_64,cVar2.tv_usec);
          now._8_8_ = &next_from_now_ms;
        }
        tStack_58 = Curl_conn_shutdown_timeleft(conn_00,(curltime *)now._8_8_);
        enext = pCVar1;
        if ((tStack_58 != 0) && (tStack_58 < ms)) {
          ms = tStack_58;
        }
      }
      else {
        Curl_node_remove(enext);
        cpool_close_and_destroy(cpool,conn_00,(Curl_easy *)0x0,false);
        enext = pCVar1;
      }
    }
    if (ms != 0) {
      Curl_expire(data_00,ms,EXPIRE_RUN_NOW);
    }
  }
  return;
}

Assistant:

static void cpool_perform(struct cpool *cpool)
{
  struct Curl_easy *data = cpool->idata;
  struct Curl_llist_node *e = Curl_llist_head(&cpool->shutdowns);
  struct Curl_llist_node *enext;
  struct connectdata *conn;
  struct curltime *nowp = NULL;
  struct curltime now;
  timediff_t next_from_now_ms = 0, ms;
  bool done;

  if(!e)
    return;

  DEBUGASSERT(data);
  DEBUGF(infof(data, "[CCACHE] perform, %zu connections being shutdown",
               Curl_llist_count(&cpool->shutdowns)));
  while(e) {
    enext = Curl_node_next(e);
    conn = Curl_node_elem(e);
    Curl_attach_connection(data, conn);
    cpool_run_conn_shutdown(data, conn, &done);
    DEBUGF(infof(data, "[CCACHE] shutdown #%" FMT_OFF_T ", done=%d",
                 conn->connection_id, done));
    Curl_detach_connection(data);
    if(done) {
      Curl_node_remove(e);
      cpool_close_and_destroy(cpool, conn, NULL, FALSE);
    }
    else {
      /* Not done, when does this connection time out? */
      if(!nowp) {
        now = Curl_now();
        nowp = &now;
      }
      ms = Curl_conn_shutdown_timeleft(conn, nowp);
      if(ms && ms < next_from_now_ms)
        next_from_now_ms = ms;
    }
    e = enext;
  }

  if(next_from_now_ms)
    Curl_expire(data, next_from_now_ms, EXPIRE_RUN_NOW);
}